

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshook.c
# Opt level: O0

int al_for_each_fs_entry
              (ALLEGRO_FS_ENTRY *dir,_func_int_ALLEGRO_FS_ENTRY_ptr_void_ptr *callback,void *extra)

{
  _Bool _Var1;
  int iVar2;
  uint32_t uVar3;
  ALLEGRO_FS_ENTRY *extra_00;
  _func_int_ALLEGRO_FS_ENTRY_ptr_void_ptr *in_RDX;
  ALLEGRO_FS_ENTRY *in_RSI;
  long in_RDI;
  int result;
  ALLEGRO_FS_ENTRY *entry;
  int in_stack_ffffffffffffffd4;
  int local_4;
  
  if ((in_RDI == 0) || (_Var1 = al_open_directory((ALLEGRO_FS_ENTRY *)0x1775a5), !_Var1)) {
    al_set_errno(in_stack_ffffffffffffffd4);
    local_4 = -1;
  }
  else {
    extra_00 = al_read_directory((ALLEGRO_FS_ENTRY *)0x1775ca);
    while (extra_00 != (ALLEGRO_FS_ENTRY *)0x0) {
      iVar2 = (*(code *)in_RSI)(extra_00,in_RDX);
      if ((iVar2 == 0) &&
         (uVar3 = al_get_fs_entry_mode((ALLEGRO_FS_ENTRY *)0x177601), (uVar3 & 0x20) != 0)) {
        iVar2 = al_for_each_fs_entry(in_RSI,in_RDX,extra_00);
      }
      al_destroy_fs_entry((ALLEGRO_FS_ENTRY *)0x17762d);
      if (iVar2 == 2) {
        return 2;
      }
      if (iVar2 == -1) {
        return -1;
      }
      extra_00 = al_read_directory((ALLEGRO_FS_ENTRY *)0x177651);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int al_for_each_fs_entry(ALLEGRO_FS_ENTRY *dir,
                         int (*callback)(ALLEGRO_FS_ENTRY *dir, void *extra),
                         void *extra)
{
   ALLEGRO_FS_ENTRY *entry;

   if (!dir || !al_open_directory(dir)) {
      al_set_errno(ENOENT);
      return ALLEGRO_FOR_EACH_FS_ENTRY_ERROR;
   }
   
   for (entry = al_read_directory(dir); entry; entry = al_read_directory(dir)) {
      /* Call the callback first. */
      int result = callback(entry, extra);
      
      /* Recurse if requested and needed. Only OK allows recursion. */
      if (result == ALLEGRO_FOR_EACH_FS_ENTRY_OK) {
         if (al_get_fs_entry_mode(entry) & ALLEGRO_FILEMODE_ISDIR) {
            result = al_for_each_fs_entry(entry, callback, extra);
         }
      }

      al_destroy_fs_entry(entry);
      
      if ((result == ALLEGRO_FOR_EACH_FS_ENTRY_STOP) ||
         (result == ALLEGRO_FOR_EACH_FS_ENTRY_ERROR)) {
         return result;
      }
   }
   
   return ALLEGRO_FOR_EACH_FS_ENTRY_OK;
}